

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildCall(CNscPStackEntry *pFn,CNscPStackEntry *pArgList)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  CNscContext *this;
  CNscPStackEntry *this_00;
  NscSymbol *pNVar5;
  size_t nDataSize;
  char *pcVar6;
  int iVar7;
  NscMessage nMessage;
  NscType nType;
  long *pauchData;
  long *plVar8;
  long *plVar9;
  int iVar10;
  
  this_00 = CNscContext::GetPStackEntryInt(g_pCtx);
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pFn != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pFn->m_link,&g_pCtx->m_listEntryFree);
    }
    if (pArgList != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pArgList->m_link,&g_pCtx->m_listEntryFree);
    }
    CNscPStackEntry::SetType(this_00,NscType_Unknown);
    return this_00;
  }
  if (pFn == (CNscPStackEntry *)0x0) {
    __assert_fail("pFn",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x11d2,"CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
  }
  pNVar5 = CNscContext::FindDeclSymbol(g_pCtx,pFn->m_pszId);
  this = g_pCtx;
  if (pNVar5 == (NscSymbol *)0x0) {
    pcVar6 = pFn->m_pszId;
    nMessage = NscMessage_ErrorUndeclaredIdentifier;
  }
  else {
    if (pNVar5->nSymType == NscSymType_Function) {
      iVar7 = 0;
      if (pArgList == (CNscPStackEntry *)0x0) {
        nDataSize = 0;
        pauchData = (long *)0x0;
      }
      else {
        pauchData = (long *)pArgList->m_pauchData;
        nDataSize = pArgList->m_nDataSize;
      }
      plVar9 = (long *)((g_pCtx->m_sSymbols).m_pauchData +
                       (pNVar5->field_6).field_1.nFirstBackLink + 0x30);
      lVar4 = plVar9[-6];
      for (plVar8 = pauchData;
          (iVar10 = (int)lVar4 + iVar7, 0 < iVar10 &&
          (plVar8 < (long *)((long)pauchData + nDataSize)));
          plVar8 = (long *)((long)plVar8 + *plVar8)) {
        if ((int)plVar8[1] != 2) {
          __assert_fail("p1 ->nOpCode == NscPCode_Argument",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0x1216,
                        "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
        }
        if ((int)plVar9[1] != 1) {
          __assert_fail("p2 ->nOpCode == NscPCode_Declaration",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0x1217,
                        "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
        }
        uVar2 = *(uint *)((long)plVar8 + 0xc);
        if (uVar2 == 2) {
LAB_0015d91a:
          CNscPStackEntry::SetType(this_00,NscType_Error);
          iVar7 = 1 - iVar7;
          goto LAB_0015d943;
        }
        uVar3 = *(uint *)((long)plVar9 + 0xc);
        if (uVar3 == 2) goto LAB_0015d91a;
        if (uVar2 != uVar3) {
          if ((((uVar2 != 1) || (uVar3 != 3)) || ((ulong)plVar8[2] < 0x30)) ||
             ((*(int *)((long)plVar8 + plVar8[3] + 8) != 4 ||
              (*(ulong *)((long)plVar8 + plVar8[3]) != plVar8[2])))) {
            CNscContext::GenerateMessage
                      (this,NscMessage_ErrorFunctionArgTypeMismatch,pFn->m_pszId,(long)plVar9 + 0x3c
                       ,(ulong)(1 - iVar7),(ulong)uVar3,uVar2);
            goto LAB_0015d91a;
          }
          *(undefined4 *)((long)plVar8 + 0xc) = 3;
        }
        plVar9 = (long *)((long)plVar9 + *plVar9);
        iVar7 = iVar7 + -1;
      }
      iVar7 = -iVar7;
LAB_0015d943:
      if (this_00->m_nType != NscType_Error) {
        if (plVar8 < (long *)((long)pauchData + nDataSize)) {
          CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorTooManyFunctionArgs,pFn->m_pszId);
          CNscPStackEntry::SetType(this_00,NscType_Error);
        }
        else {
          nType = NscType_Error;
          for (; 0 < iVar10; iVar10 = iVar10 + -1) {
            if ((int)plVar9[1] != 1) {
              __assert_fail("p2 ->nOpCode == NscPCode_Declaration",
                            "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                            ,0x127f,
                            "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
            }
            if (*(int *)((long)plVar9 + 0xc) == 2) goto LAB_0015da1c;
            if (plVar9[3] == 0) {
              CNscContext::GenerateMessage
                        (g_pCtx,NscMessage_ErrorRequiredFunctionArgMissing,(long)plVar9 + 0x3c,
                         pFn->m_pszId);
              goto LAB_0015da1c;
            }
            plVar9 = (long *)((long)plVar9 + *plVar9);
          }
          CNscPStackEntry::PushCall
                    (this_00,(pNVar5->field_6).field_2.nType,
                     (long)pNVar5 - (long)(g_pCtx->m_sSymbols).m_pauchData,(long)iVar7,
                     (uchar *)pauchData,nDataSize);
          nType = (pNVar5->field_6).field_2.nType;
LAB_0015da1c:
          CNscPStackEntry::SetType(this_00,nType);
          pbVar1 = (byte *)((long)&pNVar5->field_6 + 7);
          *pbVar1 = *pbVar1 | 4;
        }
      }
      goto LAB_0015d7f8;
    }
    pcVar6 = pFn->m_pszId;
    nMessage = NscMessage_ErrorCantInvokeIdentAsFunction;
  }
  CNscContext::GenerateMessage(g_pCtx,nMessage,pcVar6);
  CNscPStackEntry::SetType(this_00,NscType_Error);
LAB_0015d7f8:
  CNwnDoubleLinkList::InsertAfter(&pFn->m_link,&g_pCtx->m_listEntryFree);
  if (pArgList != (CNscPStackEntry *)0x0) {
    CNwnDoubleLinkList::InsertAfter(&pArgList->m_link,&g_pCtx->m_listEntryFree);
  }
  return this_00;
}

Assistant:

YYSTYPE NscBuildCall (YYSTYPE pFn, YYSTYPE pArgList)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	
	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pFn)
			g_pCtx ->FreePStackEntry (pFn);
		if (pArgList)
			g_pCtx ->FreePStackEntry (pArgList);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Search for the function in the symbol table
	//

	assert (pFn);
	NscSymbol *pSymbol = g_pCtx ->FindDeclSymbol (
		pFn ->GetIdentifier ());
	
	//
	// If the identifier wasn't found
	//

	if (pSymbol == NULL)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorUndeclaredIdentifier,
			pFn ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// If this is not a function
	//

	else if (pSymbol ->nSymType != NscSymType_Function)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorCantInvokeIdentAsFunction,
			pFn ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we have a good symbol
	//

	else
	{

		//
		// Get a pointer to the arguments
		//

		unsigned char *pauchStartData = NULL;
		size_t nDataSize = 0;
		if (pArgList)
		{
			pauchStartData = pArgList ->GetData ();
			nDataSize = pArgList ->GetDataSize ();
		}
		unsigned char *pauchData = pauchStartData;
		unsigned char *pauchEnd = &pauchData [nDataSize];

		//
		// Count the number of arguments while we make sure 
		// we don't have any type mismatches
		//

		int nArgCount = 0;
		unsigned char *pauchFnData = g_pCtx ->GetSymbolData (pSymbol ->nExtra);
		NscSymbolFunctionExtra *pfnExtra = (NscSymbolFunctionExtra *) pauchFnData;
		int nFnArgCount = pfnExtra ->nArgCount;
		pauchFnData += sizeof (NscSymbolFunctionExtra);
		while (nFnArgCount > 0 && pauchData < pauchEnd)
		{

			//
			// Get the next pair.  Arguments from the call 
			// and declarations from the prototype.
			//

			nArgCount++;
			NscPCodeArgument *p1 = (NscPCodeArgument *) pauchData;
			NscPCodeDeclaration *p2 = (NscPCodeDeclaration *) pauchFnData;
			assert (p1 ->nOpCode == NscPCode_Argument);
			assert (p2 ->nOpCode == NscPCode_Declaration);

			//
			// Check for soft errors
			//

			if (p1 ->nType == NscType_Error ||
				p2 ->nType == NscType_Error)
			{
				pOut ->SetType (NscType_Error);
				break;
			}

			//
			// Check for mismatch
			//

			if (p1 ->nType != p2 ->nType)
			{

				//
				// If the declaration type is action and the
				// argument is a void with just a call, then
				// this is really a match.
				//
				// ALSO, mutate the type of the argument
				// to an ACTION.
				//

				bool fIsBad = true;
				if (p2 ->nType == NscType_Action &&
					p1 ->nType == NscType_Void &&
					p1 ->nDataSize >= sizeof (NscPCodeCall))
				{
					NscPCodeCall *pc = (NscPCodeCall *)
						&pauchData [p1 ->nDataOffset];
					fIsBad = pc ->nOpCode != NscPCode_Call ||
						pc ->nOpSize != p1 ->nDataSize;
					if (!fIsBad)
					{
						p1 ->nType = NscType_Action;
					}
				}

				//
				// If really bad
				//

				if (fIsBad)
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorFunctionArgTypeMismatch,
						pFn ->GetIdentifier (), p2 ->szString, nArgCount,
						p2 ->nType, p1 ->nType);
					pOut ->SetType (NscType_Error);
					break;
				}
			}

			//
			// Move onto the next argument
			//

			pauchData += p1 ->nOpSize;
			pauchFnData += p2 ->nOpSize;
			nFnArgCount--;
		}

		//
		// If there wasn't an error
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Make sure we don't have extra arguments
			//

			if (pauchData < pauchEnd)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorTooManyFunctionArgs,
					pFn ->GetIdentifier ());
				pOut ->SetType (NscType_Error);
			}

			//
			// Otherwise
			//

			else 
			{

				//
				// Check to make sure all the remaining arguments are optional
				//

				while (nFnArgCount > 0)
				{

					//
					// Get declaration information
					//

					NscPCodeDeclaration *p2 = (NscPCodeDeclaration *) pauchFnData;
					assert (p2 ->nOpCode == NscPCode_Declaration);

					//
					// Check for soft errors
					//

					if (p2 ->nType == NscType_Error)
					{
						pOut ->SetType (NscType_Error);
						break;
					}

					//
					// Make sure it is optional
					//

					if (p2 ->nDataSize == 0)
					{
						g_pCtx ->GenerateMessage (NscMessage_ErrorRequiredFunctionArgMissing,
							p2 ->szString,
							pFn ->GetIdentifier ());
						pOut ->SetType (NscType_Error);
						break;
					}

					//
					// Move to the next function argument
					//

					pauchFnData += p2 ->nOpSize;
					nFnArgCount--;
				}

				//
				// If all were optional, add the call
				//

				if (nFnArgCount <= 0)
				{
					pOut ->PushCall (pSymbol ->nType, 
						g_pCtx ->GetSymbolOffset (pSymbol), 
						nArgCount, pauchStartData, nDataSize);
					pOut ->SetType (pSymbol ->nType);
				}

				//
				// Mark the function as called so that we do not allow the
				// prototype return value to be relaxed later on
				//

				NscParserReferenceSymbol (pSymbol);
			}
		}
	}

	//
	// Rundown
	//

	g_pCtx ->FreePStackEntry (pFn);
	if (pArgList)
		g_pCtx ->FreePStackEntry (pArgList);
	return pOut;
}